

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
reserve(vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  PiecewiseConstant1D *pPVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar8;
  ulong uVar9;
  PiecewiseConstant1D *pPVar7;
  
  if (this->nAlloc < n) {
    pmVar3 = (this->alloc).memoryResource;
    iVar6 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n * 0x50,8);
    pPVar7 = (PiecewiseConstant1D *)CONCAT44(extraout_var,iVar6);
    if (this->nStored != 0) {
      lVar8 = 0x20;
      uVar9 = 0;
      do {
        pPVar4 = this->ptr;
        *(undefined8 *)((long)pPVar7 + lVar8 + -0x20) =
             *(undefined8 *)((long)pPVar4 + lVar8 + -0x20);
        puVar1 = (undefined8 *)((long)pPVar7 + lVar8 + -0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pPVar7 + lVar8 + -8) = 0;
        puVar1 = (undefined8 *)((long)pPVar4 + lVar8 + -0x10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pPVar7 + lVar8 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        *(undefined8 *)((long)pPVar7 + lVar8 + -0x18) =
             *(undefined8 *)((long)pPVar4 + lVar8 + -0x18);
        *(undefined8 *)((long)pPVar4 + lVar8 + -8) = 0;
        puVar1 = (undefined8 *)((long)pPVar4 + lVar8 + -0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&(pPVar7->func).alloc.memoryResource + lVar8) =
             *(undefined8 *)((long)&(pPVar4->func).alloc.memoryResource + lVar8);
        *(undefined8 *)((long)&(pPVar7->func).nStored + lVar8) = 0;
        puVar1 = (undefined8 *)((long)&(pPVar7->func).ptr + lVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pPVar4->func).nAlloc + lVar8);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar7->func).nAlloc + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        *(undefined8 *)((long)&(pPVar7->func).ptr + lVar8) =
             *(undefined8 *)((long)&(pPVar4->func).ptr + lVar8);
        *(undefined8 *)((long)&(pPVar4->func).nStored + lVar8) = 0;
        puVar1 = (undefined8 *)((long)&(pPVar4->func).ptr + lVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&(pPVar7->cdf).ptr + lVar8) =
             *(undefined4 *)((long)&(pPVar4->cdf).ptr + lVar8);
        *(undefined8 *)((long)&(pPVar7->cdf).alloc.memoryResource + lVar8) =
             *(undefined8 *)((long)&(pPVar4->cdf).alloc.memoryResource + lVar8);
        pPVar4 = this->ptr;
        vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   ((long)&(pPVar4->func).alloc.memoryResource + lVar8));
        vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   ((long)pPVar4 + lVar8 + -0x20));
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x50;
      } while (uVar9 < this->nStored);
    }
    pmVar3 = (this->alloc).memoryResource;
    (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc * 0x50,8);
    this->nAlloc = n;
    this->ptr = pPVar7;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }